

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternMatcher.cpp
# Opt level: O3

void __thiscall AssemblyCode::PatternMatcher::PatternMatcher(PatternMatcher *this)

{
  undefined1 local_21;
  shared_ptr<IRT::CallPattern> local_20;
  
  (this->patterns).
  super__Vector_base<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->patterns).
  super__Vector_base<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->patterns).
  super__Vector_base<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::MoveFromMemByRegToReg,std::allocator<IRT::MoveFromMemByRegToReg>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MoveFromMemByRegToReg **)&local_20,(allocator<IRT::MoveFromMemByRegToReg> *)&local_21)
  ;
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveFromMemByRegToReg>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveFromMemByRegToReg> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::MemFromRegPlusConstPattern,std::allocator<IRT::MemFromRegPlusConstPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MemFromRegPlusConstPattern **)&local_20,
             (allocator<IRT::MemFromRegPlusConstPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemFromRegPlusConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MemFromRegPlusConstPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::MemFromConstPlusRegPattern,std::allocator<IRT::MemFromConstPlusRegPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MemFromConstPlusRegPattern **)&local_20,
             (allocator<IRT::MemFromConstPlusRegPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemFromConstPlusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MemFromConstPlusRegPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::MoveFromMemByRegToMemByReg,std::allocator<IRT::MoveFromMemByRegToMemByReg>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MoveFromMemByRegToMemByReg **)&local_20,
             (allocator<IRT::MoveFromMemByRegToMemByReg> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveFromMemByRegToMemByReg>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveFromMemByRegToMemByReg> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::MoveRegToMemByRegPlusConst,std::allocator<IRT::MoveRegToMemByRegPlusConst>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MoveRegToMemByRegPlusConst **)&local_20,
             (allocator<IRT::MoveRegToMemByRegPlusConst> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegToMemByRegPlusConst>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveRegToMemByRegPlusConst> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::MoveRegToMemByConstPlusReg,std::allocator<IRT::MoveRegToMemByConstPlusReg>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MoveRegToMemByConstPlusReg **)&local_20,
             (allocator<IRT::MoveRegToMemByConstPlusReg> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegToMemByConstPlusReg>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveRegToMemByConstPlusReg> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::MoveRegToMemByReg,std::allocator<IRT::MoveRegToMemByReg>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MoveRegToMemByReg **)&local_20,(allocator<IRT::MoveRegToMemByReg> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegToMemByReg>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveRegToMemByReg> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::MoveRegToMemByConst,std::allocator<IRT::MoveRegToMemByConst>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MoveRegToMemByConst **)&local_20,(allocator<IRT::MoveRegToMemByConst> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegToMemByConst>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveRegToMemByConst> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::MemFromConstPlusRegPattern,std::allocator<IRT::MemFromConstPlusRegPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MemFromConstPlusRegPattern **)&local_20,
             (allocator<IRT::MemFromConstPlusRegPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemFromConstPlusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MemFromConstPlusRegPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::MemFromRegPlusConstPattern,std::allocator<IRT::MemFromRegPlusConstPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MemFromRegPlusConstPattern **)&local_20,
             (allocator<IRT::MemFromRegPlusConstPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemFromRegPlusConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MemFromRegPlusConstPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::MoveMemFromConstPattern,std::allocator<IRT::MoveMemFromConstPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MoveMemFromConstPattern **)&local_20,
             (allocator<IRT::MoveMemFromConstPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveMemFromConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveMemFromConstPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::RegPlusConstPattern,std::allocator<IRT::RegPlusConstPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (RegPlusConstPattern **)&local_20,(allocator<IRT::RegPlusConstPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegPlusConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::RegPlusConstPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::ConstPlusRegPattern,std::allocator<IRT::ConstPlusRegPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (ConstPlusRegPattern **)&local_20,(allocator<IRT::ConstPlusRegPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::ConstPlusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::ConstPlusRegPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::CallPattern,std::allocator<IRT::CallPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CallPattern **)&local_20,(allocator<IRT::CallPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::CallPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::ConditionalJumpPattern,std::allocator<IRT::ConditionalJumpPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (ConditionalJumpPattern **)&local_20,
             (allocator<IRT::ConditionalJumpPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::ConditionalJumpPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::ConditionalJumpPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::MoveRegRegPattern,std::allocator<IRT::MoveRegRegPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MoveRegRegPattern **)&local_20,(allocator<IRT::MoveRegRegPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MoveRegRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MoveRegRegPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::RegPlusRegPattern,std::allocator<IRT::RegPlusRegPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (RegPlusRegPattern **)&local_20,(allocator<IRT::RegPlusRegPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegPlusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::RegPlusRegPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::RegMinusRegPattern,std::allocator<IRT::RegMinusRegPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (RegMinusRegPattern **)&local_20,(allocator<IRT::RegMinusRegPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegMinusRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::RegMinusRegPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::RegMulRegPattern,std::allocator<IRT::RegMulRegPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (RegMulRegPattern **)&local_20,(allocator<IRT::RegMulRegPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegMulRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::RegMulRegPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::RegModRegPattern,std::allocator<IRT::RegModRegPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (RegModRegPattern **)&local_20,(allocator<IRT::RegModRegPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegModRegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::RegModRegPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::JumpPattern,std::allocator<IRT::JumpPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (JumpPattern **)&local_20,(allocator<IRT::JumpPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::JumpPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::JumpPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::ExpPattern,std::allocator<IRT::ExpPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (ExpPattern **)&local_20,(allocator<IRT::ExpPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::ExpPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::ExpPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::NamePattern,std::allocator<IRT::NamePattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamePattern **)&local_20,(allocator<IRT::NamePattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::NamePattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::NamePattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::LabelPattern,std::allocator<IRT::LabelPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (LabelPattern **)&local_20,(allocator<IRT::LabelPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::LabelPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::LabelPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::ConstPattern,std::allocator<IRT::ConstPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (ConstPattern **)&local_20,(allocator<IRT::ConstPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::ConstPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::ConstPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::MemPattern,std::allocator<IRT::MemPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MemPattern **)&local_20,(allocator<IRT::MemPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::MemPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::MemPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IRT::RegPattern,std::allocator<IRT::RegPattern>>
            (&local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (RegPattern **)&local_20,(allocator<IRT::RegPattern> *)&local_21);
  std::vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>::
  emplace_back<std::shared_ptr<IRT::RegPattern>>
            ((vector<std::shared_ptr<IRT::TreePattern>,std::allocator<std::shared_ptr<IRT::TreePattern>>>
              *)this,(shared_ptr<IRT::RegPattern> *)&local_20);
  if (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<IRT::CallPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return;
}

Assistant:

AssemblyCode::PatternMatcher::PatternMatcher( ) {
    patterns.emplace_back( std::make_shared<IRT::MoveFromMemByRegToReg>( ));
    patterns.emplace_back( std::make_shared<IRT::MemFromRegPlusConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MemFromConstPlusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveFromMemByRegToMemByReg>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegToMemByRegPlusConst>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegToMemByConstPlusReg>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegToMemByReg>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegToMemByConst>( ));
    patterns.emplace_back( std::make_shared<IRT::MemFromConstPlusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MemFromRegPlusConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveMemFromConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegPlusConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::ConstPlusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::CallPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::ConditionalJumpPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MoveRegRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegPlusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegMinusRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegMulRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegModRegPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::JumpPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::ExpPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::NamePattern>( ));
    patterns.emplace_back( std::make_shared<IRT::LabelPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::ConstPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::MemPattern>( ));
    patterns.emplace_back( std::make_shared<IRT::RegPattern>( ));
}